

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

CoverCrossSymbol *
slang::ast::CoverCrossSymbol::fromSyntax
          (Scope *scope,CoverCrossSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitMembers)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  int iVar2;
  Compilation *scope_00;
  undefined4 extraout_var;
  CoverCrossSymbol *this;
  EVP_PKEY_CTX *src;
  Symbol *extraout_RDX;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar4;
  CoverCrossSymbol *result;
  Compilation *comp;
  CoverpointSymbol *newPoint;
  Symbol *symbol;
  IdentifierNameSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  SourceLocation loc;
  string_view name;
  iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *in_stack_fffffffffffffe18;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *in_stack_fffffffffffffe20;
  Token *in_stack_fffffffffffffe30;
  Symbol *this_00;
  __extent_storage<18446744073709551615UL> args_3;
  CoverpointSymbol *in_stack_fffffffffffffe68;
  CoverpointSymbol *in_stack_fffffffffffffe70;
  Compilation *in_stack_fffffffffffffe78;
  Scope *in_stack_fffffffffffffe80;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> local_90 [2];
  SourceLocation local_50;
  SourceLocation local_48;
  string_view local_40;
  SourceLocation local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  SyntaxNode *local_10;
  Scope *local_8;
  pointer ppAVar3;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  SourceLocation::SourceLocation(&local_30);
  if (local_10[3].parent == (SyntaxNode *)0x0) {
    local_50 = parsing::Token::location((Token *)&local_10[3].previewNode);
    local_30 = local_50;
  }
  else {
    local_40 = parsing::Token::valueText(in_stack_fffffffffffffe30);
    local_28._M_len = local_40._M_len;
    local_28._M_str = local_40._M_str;
    local_48 = parsing::Token::location((Token *)(local_10[3].parent + 1));
    local_30 = local_48;
  }
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> *)0xfb36f2);
  slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0xfb3713);
  slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0xfb3752);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
                 *)0xfb37c1);
    in_stack_fffffffffffffe80 = local_8;
    sVar4 = parsing::Token::valueText(in_stack_fffffffffffffe30);
    sVar4._M_str = sVar4._M_str;
    sVar4._M_len = (size_t)in_stack_fffffffffffffe80;
    in_stack_fffffffffffffe78 = (Compilation *)Scope::find((Scope *)in_stack_fffffffffffffe78,sVar4)
    ;
    if ((in_stack_fffffffffffffe78 == (Compilation *)0x0) ||
       (*(SymbolKind *)&(in_stack_fffffffffffffe78->super_BumpAllocator).head != Coverpoint)) {
      in_stack_fffffffffffffe68 =
           CoverpointSymbol::fromImplicit
                     ((Scope *)in_stack_fffffffffffffe70,
                      (IdentifierNameSyntax *)in_stack_fffffffffffffe68);
      SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::push_back
                (in_stack_fffffffffffffe20,(CoverpointSymbol **)in_stack_fffffffffffffe18);
      SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffe20,
                 (Symbol **)in_stack_fffffffffffffe18);
    }
    else {
      in_stack_fffffffffffffe70 = Symbol::as<slang::ast::CoverpointSymbol>((Symbol *)0xfb3872);
      SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::push_back
                (in_stack_fffffffffffffe20,(CoverpointSymbol **)in_stack_fffffffffffffe18);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_false>
                *)in_stack_fffffffffffffe20);
  }
  scope_00 = Scope::getCompilation(local_8);
  args_3._M_extent_value = (size_t)scope_00;
  iVar2 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    (local_90,(EVP_PKEY_CTX *)scope_00,src);
  ppAVar3 = (pointer)CONCAT44(extraout_var,iVar2);
  this_00 = extraout_RDX;
  this = BumpAllocator::
         emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                   ((BumpAllocator *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
                    (SourceLocation *)in_stack_fffffffffffffe68,
                    (span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *)
                    args_3._M_extent_value);
  Symbol::setSyntax(&this->super_Symbol,local_10);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             local_8,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this);
  syntax_00._M_extent._M_extent_value = args_3._M_extent_value;
  syntax_00._M_ptr = ppAVar3;
  Symbol::setAttributes(this_00,(Scope *)scope_00,syntax_00);
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> *)0xfb3a80);
  return this;
}

Assistant:

CoverCrossSymbol& CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                               SmallVectorBase<const Symbol*>& implicitMembers) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            implicitMembers.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}